

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O0

int stopcheck2_mt(double fx,int N,double fo,double *jac,double *dx,double eps,double stoptol,
                 double functol,int retval)

{
  double dVar1;
  undefined8 local_70;
  double relfit;
  double nrmnx;
  double nrm;
  int rcode;
  int retval_local;
  double functol_local;
  double stoptol_local;
  double eps_local;
  double *dx_local;
  double *jac_local;
  double fo_local;
  int N_local;
  double fx_local;
  
  if (retval == 3) {
    fx_local._4_4_ = 4;
  }
  else if (retval == 0xf) {
    fx_local._4_4_ = 0xf;
  }
  else {
    dVar1 = l2norm(jac,N);
    if (eps <= ABS(fo)) {
      local_70 = (fx - fo) / fo;
    }
    else {
      local_70 = fx - fo;
    }
    local_70 = ABS(local_70);
    if (stoptol <= dVar1 / (double)N) {
      if (functol <= local_70) {
        fx_local._4_4_ = 0;
      }
      else {
        fx_local._4_4_ = 6;
      }
    }
    else {
      fx_local._4_4_ = 1;
    }
  }
  return fx_local._4_4_;
}

Assistant:

int stopcheck2_mt(double fx, int N, double fo, double *jac, double *dx, double eps,double stoptol, double functol, int retval) {
	int rcode;
	double nrm,nrmnx,relfit;
	rcode = 0;


	if (retval == 3) {
		rcode = 4;
		return rcode;
	}
	if (retval == 15) {
		rcode = 15;
		return rcode;
	}

	nrm = l2norm(jac, N);
	nrmnx = nrm / (double) N;

	if (fabs(fo) < eps) {
		relfit = fabs(fx - fo);
	}
	else {
		relfit = fabs((fx - fo)/fo);
	}

	if (nrmnx < stoptol) {
		return 1; // Successful Convergence
	} else if (relfit < functol) {
		return 6; // Relative fit less than function tolerance
	}

	return rcode;
}